

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

string * __thiscall
t_rs_generator::string_container_write_variable
          (string *__return_storage_ptr__,t_rs_generator *this,t_type *ttype,string *base_var)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  byte bVar2;
  int iVar3;
  t_type *ptVar4;
  long *plVar5;
  size_type *psVar6;
  byte bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ptVar4 = t_type::get_true_type(ttype);
  iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[5])(ptVar4);
  if ((char)iVar3 == '\0') {
    bVar7 = 0;
  }
  else {
    iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[6])(ptVar4);
    bVar7 = (byte)iVar3 ^ 1;
  }
  ptVar4 = t_type::get_true_type(ttype);
  iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[5])(ptVar4);
  if (((char)iVar3 == '\0') || (bVar2 = 1, *(int *)&ptVar4[1].super_t_doc._vptr_t_doc != 7)) {
    bVar2 = 0;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((bVar2 & bVar7) == 1) {
    std::operator+(&local_48,"(*",base_var);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar6 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_68.field_2._M_allocated_capacity = *psVar6;
      local_68.field_2._8_8_ = plVar5[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar6;
      local_68._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_68._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    pbVar1 = &local_48;
  }
  else {
    if (bVar7 == 0) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_68,"*",base_var);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    pbVar1 = &local_68;
    local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &pbVar1->field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::string_container_write_variable(t_type* ttype, const string& base_var) {
  bool type_needs_deref = needs_deref_on_container_write(ttype);
  bool type_is_double = is_double(ttype);

  string write_variable;

  if (type_is_double && type_needs_deref) {
    write_variable = "(*" + base_var + ")";
  } else if (type_needs_deref) {
    write_variable = "*" + base_var;
  } else {
    write_variable = base_var;
  }

  return write_variable;
}